

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

size_t CVmObjString::copy_latin1_to_string(char *str,size_t len,CVmDataSource *src)

{
  byte bVar1;
  long *in_RDX;
  ulong in_RSI;
  byte *in_RDI;
  uchar c;
  char *p;
  int cur;
  char buf [1024];
  size_t tot;
  byte *local_438;
  int local_42c;
  byte local_428 [1032];
  size_t local_20;
  long *local_18;
  ulong local_10;
  byte *local_8;
  
  local_20 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  (**(code **)(*in_RDX + 0x40))(in_RDX,0,0);
  while (local_42c = (**(code **)(*local_18 + 0x18))(local_18,local_428,0x400), local_42c != 0) {
    local_438 = local_428;
    for (; local_42c != 0; local_42c = local_42c + -1) {
      bVar1 = *local_438;
      if (bVar1 < 0x80) {
        local_20 = local_20 + 1;
        if ((local_8 != (byte *)0x0) && (local_20 <= local_10)) {
          *local_8 = bVar1;
          local_8 = local_8 + 1;
        }
      }
      else {
        local_20 = local_20 + 2;
        if ((local_8 != (byte *)0x0) && (local_20 <= local_10)) {
          *local_8 = (byte)((int)(uint)bVar1 >> 6) | 0xc0;
          local_8[1] = bVar1 & 0x3f | 0x80;
          local_8 = local_8 + 2;
        }
      }
      local_438 = local_438 + 1;
    }
  }
  return local_20;
}

Assistant:

size_t CVmObjString::copy_latin1_to_string(char *str, size_t len,
                                           CVmDataSource *src)
{
    /* we haven't copied any bytes out yet */
    size_t tot = 0;

    /* seek to the start of the source */
    src->seek(0, OSFSK_SET);

    /* keep going until we reach EOF */
    for (;;)
    {
        /* read the next chunk of bytes from the source */
        char buf[1024];
        int cur = src->readc(buf, sizeof(buf));

        /* if there's nothing left, we're done */
        if (cur == 0)
            return tot;

        /* scan the buffer */
        for (char *p = buf ; cur != 0 ; ++p, --cur)
        {
            /* 
             *   if this character is from 0 to 127, store one byte;
             *   otherwise store it as two bytes in UTF-8 format 
             */
            unsigned char c = *(unsigned char *)p;
            if (c <= 127)
            {
                /* 0..127 -> single byte UTF-8 character */
                tot += 1;
                if (str != 0 && tot <= len)
                    *str++ = c;
            }
            else
            {
                /* 128.255 -> two-byte UTF-8 character */
                tot += 2;
                if (str != 0 && tot <= len)
                {
                    *str++ = (char)(0xC0 | ((c >> 6) & 0x1F));
                    *str++ = (char)(0x80 | (c & 0x3F));
                }
            }
        }
    }
}